

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_codegen.c
# Opt level: O0

void visit_loop_while_stmt(gvisitor_t *self,gnode_loop_stmt_t *node)

{
  long *plVar1;
  ircode_t *code_00;
  uint32_t nlabel;
  uint32_t nlabel_00;
  uint32_t uVar2;
  uint32_t local_9c;
  uint32_t local_8c;
  uint32_t local_7c;
  uint32_t local_64;
  uint32_t local_54;
  uint32_t reg;
  uint32_t labelCheck;
  uint32_t labelFalse;
  uint32_t labelTrue;
  ircode_t *code;
  gravity_function_t *context_function;
  gravity_object_t *context_object;
  gnode_loop_stmt_t *node_local;
  gvisitor_t *self_local;
  
  plVar1 = *(long **)(*(long *)((long)self->data + 0x10) + (*self->data + -1) * 8);
  if ((plVar1 == (long *)0x0) || ((gravity_class_t *)*plVar1 != gravity_class_function)) {
    report_error(self,&node->base,"Invalid code context.");
  }
  else {
    code_00 = (ircode_t *)plVar1[0x14];
    nlabel = ircode_newlabel(code_00);
    nlabel_00 = ircode_newlabel(code_00);
    uVar2 = ircode_newlabel(code_00);
    ircode_setlabel_true(code_00,nlabel);
    ircode_setlabel_false(code_00,nlabel_00);
    ircode_setlabel_check(code_00,uVar2);
    if (node == (gnode_loop_stmt_t *)0x0) {
      local_54 = 0;
    }
    else {
      local_54 = (node->base).token.lineno;
    }
    ircode_marklabel(code_00,nlabel,local_54);
    if (node == (gnode_loop_stmt_t *)0x0) {
      local_64 = 0;
    }
    else {
      local_64 = (node->base).token.lineno;
    }
    ircode_marklabel(code_00,uVar2,local_64);
    gvisit(self,node->cond);
    uVar2 = ircode_register_pop(code_00);
    if (uVar2 == 0xffffffff) {
      report_error(self,&node->base,"Invalid while condition expression.");
    }
    if (node == (gnode_loop_stmt_t *)0x0) {
      local_7c = 0;
    }
    else {
      local_7c = (node->base).token.lineno;
    }
    ircode_add(code_00,JUMPF,uVar2,nlabel_00,0,local_7c);
    gvisit(self,node->stmt);
    if (node == (gnode_loop_stmt_t *)0x0) {
      local_8c = 0;
    }
    else {
      local_8c = (node->base).token.lineno;
    }
    ircode_add(code_00,JUMP,nlabel,0,0,local_8c);
    if (node == (gnode_loop_stmt_t *)0x0) {
      local_9c = 0;
    }
    else {
      local_9c = (node->base).token.lineno;
    }
    ircode_marklabel(code_00,nlabel_00,local_9c);
    ircode_unsetlabel_true(code_00);
    ircode_unsetlabel_false(code_00);
    ircode_unsetlabel_check(code_00);
  }
  return;
}

Assistant:

static void visit_loop_while_stmt (gvisitor_t *self, gnode_loop_stmt_t *node) {
    DEBUG_CODEGEN("visit_loop_while_stmt");
    DECLARE_CODE();

    /*
         $start:    <condition>
         if-false: goto $end
         <body>
         goto $start
         $end:

         START := getLabel
         END  := getLabel
         emit START
         compile exp
         emit ifeq END
         compile stm
         emit goto START
         emit END
     */

    uint32_t labelTrue  = ircode_newlabel(code);
    uint32_t labelFalse = ircode_newlabel(code);
    uint32_t labelCheck = ircode_newlabel(code);
    ircode_setlabel_true(code, labelTrue);
    ircode_setlabel_false(code, labelFalse);
    ircode_setlabel_check(code, labelCheck);

	ircode_marklabel(code, labelTrue, LINE_NUMBER(node));
    ircode_marklabel(code, labelCheck, LINE_NUMBER(node));
    visit(node->cond);
    uint32_t reg = ircode_register_pop(code);
    if (reg == REGISTER_ERROR) report_error(self, (gnode_t *)node, "Invalid while condition expression.");
	ircode_add(code, JUMPF, reg, labelFalse, 0, LINE_NUMBER(node));

    visit(node->stmt);
	ircode_add(code, JUMP, labelTrue, 0, 0, LINE_NUMBER(node));

	ircode_marklabel(code, labelFalse, LINE_NUMBER(node));

    ircode_unsetlabel_true(code);
    ircode_unsetlabel_false(code);
    ircode_unsetlabel_check(code);
}